

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageFederateManager.cpp
# Opt level: O0

Endpoint * __thiscall
helics::MessageFederateManager::getDataSink(MessageFederateManager *this,string_view name)

{
  bool bVar1;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> ept;
  handle sharedEpt;
  BlockIterator<const_helics::Endpoint,_32,_const_helics::Endpoint_*const_*>
  *in_stack_ffffffffffffff38;
  undefined7 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff47;
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  *in_stack_ffffffffffffff78;
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>
  *in_stack_ffffffffffffff80;
  string_view in_stack_ffffffffffffff88;
  BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> local_50;
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  local_38 [2];
  Endpoint *local_8;
  
  gmlc::libguarded::
  shared_guarded_opt<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::lock(in_stack_ffffffffffffff78);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::operator->(local_38);
  gmlc::containers::
  DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>::find
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::end((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
         *)CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40));
  bVar1 = gmlc::containers::BlockIterator<helics::Endpoint,32,helics::Endpoint**>::operator==
                    ((BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**> *)
                     CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                     in_stack_ffffffffffffff38);
  if (bVar1) {
    local_8 = (Endpoint *)invalidEptNC;
  }
  else {
    gmlc::containers::BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::operator->
              (&local_50);
    Endpoint::getType_abi_cxx11_((Endpoint *)0x27f143);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            CONCAT17(in_stack_ffffffffffffff47,in_stack_ffffffffffffff40),
                            (char *)in_stack_ffffffffffffff38);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_8 = gmlc::containers::BlockIterator<helics::Endpoint,_32,_helics::Endpoint_**>::
                operator*(&local_50);
    }
    else {
      local_8 = (Endpoint *)invalidEptNC;
    }
  }
  gmlc::libguarded::
  lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
  ::~lock_handle((lock_handle<gmlc::containers::DualStringMappedVector<helics::Endpoint,_helics::InterfaceHandle,_(reference_stability)0,_5>,_std::shared_mutex>
                  *)0x27f1b7);
  return local_8;
}

Assistant:

Endpoint& MessageFederateManager::getDataSink(std::string_view name)
{
    auto sharedEpt = mLocalEndpoints.lock();
    auto ept = sharedEpt->find(name);
    if (ept == sharedEpt.end()) {
        return invalidEptNC;
    }
    if (ept->getType() != "sink") {
        return invalidEptNC;
    }
    return *ept;
}